

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O3

callback_t *
state_include(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  void *pvVar1;
  int *piVar2;
  char cVar3;
  QTextStream *pQVar4;
  initializer_list<char> __l;
  initializer_list<char> __l_00;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  MetaInclude include;
  string include_name;
  QTextStream *local_d0;
  undefined1 local_c8 [32];
  bool local_a8;
  string local_a0;
  QString local_80;
  undefined2 local_68;
  undefined2 uStack_66;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined8 uStack_5c;
  undefined4 local_54;
  undefined8 local_50;
  string local_48;
  
  local_a0._M_dataplus._M_p._0_2_ = 0x223c;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_a0;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_c8,__l,(allocator_type *)&local_68);
  read_untill_delimiters_abi_cxx11_(&local_48,f,(vector<char,_std::allocator<char>_> *)local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pvVar1 = (void *)CONCAT44(local_c8._4_4_,local_c8._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,CONCAT44(local_c8._20_4_,local_c8._16_4_) - (long)pvVar1);
  }
  cVar3 = std::istream::get();
  local_c8._0_4_ = 2;
  local_c8._4_4_ = 0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_4_ = 0;
  local_c8._20_4_ = 0;
  local_c8._24_8_ = "default";
  QMessageLogger::debug();
  pQVar4 = (QTextStream *)CONCAT44(uStack_64,CONCAT22(uStack_66,local_68));
  QVar5.m_data = (storage_type *)0x9;
  QVar5.m_size = (qsizetype)&local_a0;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<(pQVar4,(QString *)&local_a0);
  piVar2 = (int *)CONCAT62(local_a0._M_dataplus._M_p._2_6_,local_a0._M_dataplus._M_p._0_2_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate
                ((QArrayData *)
                 CONCAT62(local_a0._M_dataplus._M_p._2_6_,local_a0._M_dataplus._M_p._0_2_),2,8);
    }
  }
  pQVar4 = (QTextStream *)CONCAT44(uStack_64,CONCAT22(uStack_66,local_68));
  if (pQVar4[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar4,' ');
    pQVar4 = (QTextStream *)CONCAT44(uStack_64,CONCAT22(uStack_66,local_68));
  }
  QTextStream::operator<<(pQVar4,cVar3);
  pQVar4 = (QTextStream *)CONCAT44(uStack_64,CONCAT22(uStack_66,local_68));
  if (pQVar4[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar4,' ');
  }
  QDebug::~QDebug((QDebug *)&local_68);
  local_68 = 0x223e;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_68;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_c8,__l_00,(allocator_type *)&local_80);
  read_untill_delimiters_abi_cxx11_(&local_a0,f,(vector<char,_std::allocator<char>_> *)local_c8);
  pvVar1 = (void *)CONCAT44(local_c8._4_4_,local_c8._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,CONCAT44(local_c8._20_4_,local_c8._16_4_) - (long)pvVar1);
  }
  std::istream::ignore();
  local_c8._0_8_ = local_c8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,
             CONCAT62(local_a0._M_dataplus._M_p._2_6_,local_a0._M_dataplus._M_p._0_2_),
             local_a0._M_string_length +
             CONCAT62(local_a0._M_dataplus._M_p._2_6_,local_a0._M_dataplus._M_p._0_2_));
  local_a8 = cVar3 == '<';
  std::vector<MetaInclude,_std::allocator<MetaInclude>_>::push_back
            (&conf->includes,(value_type *)local_c8);
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_68 = 2;
    uStack_66 = 0;
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    local_54 = 0;
    local_50 = parser()::category._8_8_;
    QMessageLogger::debug();
    pQVar4 = local_d0;
    QVar6.m_data = (storage_type *)0xf;
    QVar6.m_size = (qsizetype)&local_80;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<(pQVar4,&local_80);
    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_d0[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_d0,' ');
    }
    operator<<((QDebug *)&local_d0,&local_a0);
    QDebug::~QDebug((QDebug *)&local_d0);
  }
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = initial_state;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,CONCAT44(local_c8._20_4_,local_c8._16_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT62(local_a0._M_dataplus._M_p._2_6_,local_a0._M_dataplus._M_p._0_2_) !=
      &local_a0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT62(local_a0._M_dataplus._M_p._2_6_,local_a0._M_dataplus._M_p._0_2_),
                    local_a0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

callback_t state_include(MetaConfiguration &conf, std::ifstream &f, int &error) {
  read_untill_delimiters(f, {'<', '"'});

  char start_delimiter = f.get();
  qDebug() << "Delimiter" << start_delimiter;
  std::string include_name = read_untill_delimiters(f, {'>', '"'});
  f.ignore(); // ignore the end delimiter.

  MetaInclude include {
    include_name,
    start_delimiter == '<'
  };

  conf.includes.push_back(include);
  qCDebug(parser) << "include added: " << include_name;
  return initial_state;
}